

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichTextTests.cpp
# Opt level: O2

void __thiscall agge::tests::RichTextTests::StyleAtributesCanBeResetToBase(RichTextTests *this)

{
  undefined4 uVar1;
  pointer ppVar2;
  annotated_string<char,_agge::font_style_annotation> *paVar3;
  style_modifier sStack_2a8;
  style_modifier local_278;
  allocator local_241;
  style_modifier local_240;
  style_modifier local_210;
  style_modifier local_1e0;
  richtext_t text;
  style_modifier local_148;
  style_modifier local_118;
  style_modifier local_e8;
  style_modifier local_b8;
  style_modifier local_88;
  string local_58;
  font_style_annotation local_38;
  
  std::__cxx11::string::string((string *)&text,"Arial",(allocator *)&local_278);
  font_descriptor::create(&local_38.basic,&text._underlying,0xf,regular,true,hint_none);
  local_38.foreground.r = '\0';
  local_38.foreground.g = '\0';
  local_38.foreground.b = '\0';
  local_38.foreground.a = '\0';
  std::__cxx11::string::~string((string *)&text);
  annotated_string<char,_agge::font_style_annotation>::annotated_string(&text,&local_38);
  paVar3 = operator<<(&text,"foobar");
  std::__cxx11::string::string((string *)&local_118,"Tahoma",(allocator *)&local_58);
  style::family(&local_1e0,(string *)&local_118);
  style::height(&local_148,0x14);
  style_modifier::operator+(&local_210,&local_1e0,&local_148);
  style::weight(&local_88,bold);
  style_modifier::operator+(&local_240,&local_210,&local_88);
  style::italic(&local_b8,false);
  style_modifier::operator+(&sStack_2a8,&local_240,&local_b8);
  style::hinting(&local_e8,hint_strong);
  style_modifier::operator+(&local_278,&sStack_2a8,&local_e8);
  operator<<(paVar3,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_118);
  style::family_base();
  operator<<(&text,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  ppVar2 = text._annotations.
           super__Vector_base<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string
            ((string *)&sStack_2a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,(allocator *)&local_240);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_278,(string *)&sStack_2a8,0xca);
  ut::are_equal<char,6ul>
            ((char (*) [6])"Arial",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ppVar2 + -1),
             (LocationInfo *)&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  style::height_base();
  operator<<(&text,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  local_240.basic.family._M_dataplus._M_p._0_4_ = 0xf;
  local_210.basic.family._M_dataplus._M_p._0_4_ =
       (*(int *)&text._annotations.
                 super__Vector_base<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first.basic.field_0x20 << 0xc) >>
       0xc;
  std::__cxx11::string::string
            ((string *)&sStack_2a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,(allocator *)&local_1e0);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_278,(string *)&sStack_2a8,0xcc);
  ut::are_equal<int,int>((int *)&local_240,(int *)&local_210,(LocationInfo *)&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  style::weight_base();
  operator<<(&text,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  local_240.basic.family._M_dataplus._M_p._0_4_ = 3;
  local_210.basic.family._M_dataplus._M_p._0_4_ =
       *(uint *)&text._annotations.
                 super__Vector_base<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first.basic.field_0x20 >> 0x14 & 0xf
  ;
  std::__cxx11::string::string
            ((string *)&sStack_2a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,(allocator *)&local_1e0);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_278,(string *)&sStack_2a8,0xce);
  ut::are_equal<agge::font_weight,agge::font_weight>
            ((font_weight *)&local_240,(font_weight *)&local_210,(LocationInfo *)&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  style::italic_base();
  operator<<(&text,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  uVar1 = *(undefined4 *)
           &text._annotations.
            super__Vector_base<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].first.basic.field_0x20;
  std::__cxx11::string::string
            ((string *)&sStack_2a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,(allocator *)&local_240);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_278,(string *)&sStack_2a8,0xd0);
  ut::is_true((bool)((byte)((uint)uVar1 >> 0x18) & 1),(LocationInfo *)&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  style::hinting_base();
  operator<<(&text,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  local_240.basic.family._M_dataplus._M_p._0_4_ = 0;
  local_210.basic.family._M_dataplus._M_p._0_4_ =
       *(uint *)&text._annotations.
                 super__Vector_base<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first.basic.field_0x20 >> 0x19 & 3;
  std::__cxx11::string::string
            ((string *)&sStack_2a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,(allocator *)&local_1e0);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_278,(string *)&sStack_2a8,0xd2);
  ut::are_equal<agge::font_hinting,agge::font_hinting>
            ((font_hinting *)&local_240,(font_hinting *)&local_210,(LocationInfo *)&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  std::__cxx11::string::string((string *)&sStack_2a8,"Segoe",(allocator *)&local_240);
  font_descriptor::create(&local_278.basic,(string *)&sStack_2a8,0x10,light,false,hint_vertical);
  local_278.foreground.r = '\0';
  local_278.foreground.g = '\0';
  local_278.foreground.b = '\0';
  local_278.foreground.a = '\0';
  std::__cxx11::string::~string((string *)&sStack_2a8);
  annotated_string<char,_agge::font_style_annotation>::set_base_annotation
            (&text,(font_style_annotation *)&local_278);
  paVar3 = operator<<(&text,"foobar");
  std::__cxx11::string::string((string *)&local_58,"Tahoma",&local_241);
  style::family(&local_148,&local_58);
  style::height(&local_88,0x14);
  style_modifier::operator+(&local_1e0,&local_148,&local_88);
  style::weight(&local_b8,bold);
  style_modifier::operator+(&local_210,&local_1e0,&local_b8);
  style::italic(&local_e8,true);
  style_modifier::operator+(&local_240,&local_210,&local_e8);
  style::hinting(&local_118,hint_strong);
  style_modifier::operator+(&sStack_2a8,&local_240,&local_118);
  operator<<(paVar3,&sStack_2a8);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_58);
  style::family_base();
  operator<<(&text,&sStack_2a8);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  ppVar2 = text._annotations.
           super__Vector_base<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string
            ((string *)&local_240,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,(allocator *)&local_210);
  ut::LocationInfo::LocationInfo((LocationInfo *)&sStack_2a8,(string *)&local_240,0xdd);
  ut::are_equal<char,6ul>
            ((char (*) [6])"Segoe",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ppVar2 + -1),
             (LocationInfo *)&sStack_2a8);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  std::__cxx11::string::~string((string *)&local_240);
  style::height_base();
  operator<<(&text,&sStack_2a8);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  local_210.basic.family._M_dataplus._M_p._0_4_ = 0x10;
  local_1e0.basic.family._M_dataplus._M_p._0_4_ =
       (*(int *)&text._annotations.
                 super__Vector_base<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first.basic.field_0x20 << 0xc) >>
       0xc;
  std::__cxx11::string::string
            ((string *)&local_240,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,(allocator *)&local_148);
  ut::LocationInfo::LocationInfo((LocationInfo *)&sStack_2a8,(string *)&local_240,0xdf);
  ut::are_equal<int,int>((int *)&local_210,(int *)&local_1e0,(LocationInfo *)&sStack_2a8);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  std::__cxx11::string::~string((string *)&local_240);
  style::weight_base();
  operator<<(&text,&sStack_2a8);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  local_210.basic.family._M_dataplus._M_p._0_4_ = 1;
  local_1e0.basic.family._M_dataplus._M_p._0_4_ =
       *(uint *)&text._annotations.
                 super__Vector_base<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first.basic.field_0x20 >> 0x14 & 0xf
  ;
  std::__cxx11::string::string
            ((string *)&local_240,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,(allocator *)&local_148);
  ut::LocationInfo::LocationInfo((LocationInfo *)&sStack_2a8,(string *)&local_240,0xe1);
  ut::are_equal<agge::font_weight,agge::font_weight>
            ((font_weight *)&local_210,(font_weight *)&local_1e0,(LocationInfo *)&sStack_2a8);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  std::__cxx11::string::~string((string *)&local_240);
  style::italic_base();
  operator<<(&text,&sStack_2a8);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  uVar1 = *(undefined4 *)
           &text._annotations.
            super__Vector_base<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].first.basic.field_0x20;
  std::__cxx11::string::string
            ((string *)&local_240,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,(allocator *)&local_210);
  ut::LocationInfo::LocationInfo((LocationInfo *)&sStack_2a8,(string *)&local_240,0xe3);
  ut::is_false((bool)((byte)((uint)uVar1 >> 0x18) & 1),(LocationInfo *)&sStack_2a8);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  std::__cxx11::string::~string((string *)&local_240);
  style::hinting_base();
  operator<<(&text,&sStack_2a8);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  local_210.basic.family._M_dataplus._M_p._0_4_ = 1;
  local_1e0.basic.family._M_dataplus._M_p._0_4_ =
       *(uint *)&text._annotations.
                 super__Vector_base<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first.basic.field_0x20 >> 0x19 & 3;
  std::__cxx11::string::string
            ((string *)&local_240,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,(allocator *)&local_148);
  ut::LocationInfo::LocationInfo((LocationInfo *)&sStack_2a8,(string *)&local_240,0xe5);
  ut::are_equal<agge::font_hinting,agge::font_hinting>
            ((font_hinting *)&local_210,(font_hinting *)&local_1e0,(LocationInfo *)&sStack_2a8);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_278);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&text);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

test( StyleAtributesCanBeResetToBase )
			{
				// INIT
				font_style_annotation a1 = {	font_descriptor::create("Arial", 15, regular, true, hint_none),	};
				richtext_t text(a1);

				text << "foobar" << style::family("Tahoma") + style::height(20) + style::weight(bold) + style::italic(false)
					+ style::hinting(hint_strong);

				// ACT / ASSERT
				text << style::family_base();
				assert_equal("Arial", text.current_annotation().basic.family);
				text << style::height_base();
				assert_equal(15, text.current_annotation().basic.height);
				text << style::weight_base();
				assert_equal(regular, text.current_annotation().basic.weight);
				text << style::italic_base();
				assert_is_true(text.current_annotation().basic.italic);
				text << style::hinting_base();
				assert_equal(hint_none, text.current_annotation().basic.hinting);

				// INIT
				font_style_annotation a2 = {	font_descriptor::create("Segoe", 16, light, false, hint_vertical),	};

				text.set_base_annotation(a2);
				text << "foobar" << style::family("Tahoma") + style::height(20) + style::weight(bold) + style::italic(true)
					+ style::hinting(hint_strong);

				// ACT / ASSERT
				text << style::family_base();
				assert_equal("Segoe", text.current_annotation().basic.family);
				text << style::height_base();
				assert_equal(16, text.current_annotation().basic.height);
				text << style::weight_base();
				assert_equal(light, text.current_annotation().basic.weight);
				text << style::italic_base();
				assert_is_false(text.current_annotation().basic.italic);
				text << style::hinting_base();
				assert_equal(hint_vertical, text.current_annotation().basic.hinting);
			}